

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void prvTidyInsertNodeAfterElement(Node *element,Node *node)

{
  Node *pNVar1;
  Node **ppNVar2;
  
  pNVar1 = element->parent;
  node->parent = pNVar1;
  if ((pNVar1 == (Node *)0x0) || (pNVar1->last != element)) {
    pNVar1 = element->next;
    node->next = pNVar1;
    if (pNVar1 == (Node *)0x0) goto LAB_0013f285;
    ppNVar2 = &pNVar1->prev;
  }
  else {
    ppNVar2 = &pNVar1->last;
  }
  *ppNVar2 = node;
LAB_0013f285:
  element->next = node;
  node->prev = element;
  return;
}

Assistant:

void TY_(InsertNodeAfterElement)(Node *element, Node *node)
{
    Node *parent;

    parent = element->parent;
    node->parent = parent;

    /* AQ - 13 Jan 2000 fix for parent == NULL */
    if (parent != NULL && parent->last == element)
        parent->last = node;
    else
    {
        node->next = element->next;
        /* AQ - 13 Jan 2000 fix for node->next == NULL */
        if (node->next != NULL)
            node->next->prev = node;
    }

    element->next = node;
    node->prev = element;
}